

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  pointer pRVar4;
  ulong uVar5;
  ostream *local_240;
  ostream *s;
  ofstream fout;
  __normal_iterator<cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
  local_30;
  __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
  local_28;
  const_iterator i;
  bool result;
  int count;
  ostream *os_local;
  cmDocumentation *this_local;
  
  i._M_current._4_4_ = 0;
  i._M_current._3_1_ = 1;
  local_30._M_current =
       (RequestedHelpItem *)
       std::
       vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
       ::begin(&this->RequestedHelpItems);
  __gnu_cxx::
  __normal_iterator<cmDocumentation::RequestedHelpItem_const*,std::vector<cmDocumentation::RequestedHelpItem,std::allocator<cmDocumentation::RequestedHelpItem>>>
  ::__normal_iterator<cmDocumentation::RequestedHelpItem*>
            ((__normal_iterator<cmDocumentation::RequestedHelpItem_const*,std::vector<cmDocumentation::RequestedHelpItem,std::allocator<cmDocumentation::RequestedHelpItem>>>
              *)&local_28,&local_30);
  while( true ) {
    fout._504_8_ = std::
                   vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                   ::end(&this->RequestedHelpItems);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
                        *)&fout.field_0x1f8);
    if (!bVar1) break;
    pRVar4 = __gnu_cxx::
             __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::operator=((string *)&this->CurrentArgument,(string *)&pRVar4->Argument);
    std::ofstream::ofstream(&s);
    __gnu_cxx::
    __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
    ::operator->(&local_28);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
      ::operator->(&local_28);
      _Var3 = std::__cxx11::string::c_str();
      std::ofstream::open((char *)&s,_Var3);
      local_240 = (ostream *)&s;
    }
    else {
      i._M_current._4_4_ = i._M_current._4_4_ + 1;
      local_240 = os;
      if (1 < i._M_current._4_4_) {
        std::operator<<(os,"\n\n");
      }
    }
    pRVar4 = __gnu_cxx::
             __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
             ::operator->(&local_28);
    bVar1 = PrintDocumentation(this,pRVar4->HelpType,local_240);
    if ((!bVar1) || (bVar2 = std::ios::fail(), (bVar2 & 1) != 0)) {
      i._M_current._3_1_ = 0;
    }
    std::ofstream::~ofstream(&s);
    __gnu_cxx::
    __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
    ::operator++(&local_28);
  }
  return (bool)(i._M_current._3_1_ & 1);
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for (std::vector<RequestedHelpItem>::const_iterator i =
         this->RequestedHelpItems.begin();
       i != this->RequestedHelpItems.end(); ++i) {
    this->CurrentArgument = i->Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream fout;
    std::ostream* s = &os;
    if (!i->Filename.empty()) {
      fout.open(i->Filename.c_str());
      s = &fout;
    } else if (++count > 1) {
      os << "\n\n";
    }

    // Print this documentation type to the stream.
    if (!this->PrintDocumentation(i->HelpType, *s) || s->fail()) {
      result = false;
    }
  }
  return result;
}